

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O3

void __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::setup
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this)

{
  double dVar1;
  pointer puVar2;
  ProblemGraph *pPVar3;
  pointer puVar4;
  undefined1 auVar5 [16];
  pointer pEVar6;
  mapped_type_conflict *pmVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Data *pDVar11;
  value_type_conflict4 vVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  key_type local_50;
  Solution local_48;
  
  auVar5 = _DAT_00124060;
  pDVar11 = this->data_;
  puVar2 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar3 = pDVar11->problemGraph;
  puVar4 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar4) {
    uVar8 = (long)puVar4 + (-8 - (long)puVar2);
    auVar15._8_4_ = (int)uVar8;
    auVar15._0_8_ = uVar8;
    auVar15._12_4_ = (int)(uVar8 >> 0x20);
    auVar13._0_8_ = uVar8 >> 3;
    auVar13._8_8_ = auVar15._8_8_ >> 3;
    uVar9 = 0;
    auVar13 = auVar13 ^ _DAT_00124060;
    auVar14 = _DAT_00124050;
    do {
      auVar15 = auVar14 ^ auVar5;
      if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                  auVar13._4_4_ < auVar15._4_4_) & 1)) {
        puVar2[uVar9] = uVar9;
      }
      if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
          auVar15._12_4_ <= auVar13._12_4_) {
        puVar2[uVar9 + 1] = uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar10 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar10 + 2;
    } while (((uVar8 >> 3) + 2 & 0xfffffffffffffffe) != uVar9);
  }
  pEVar6 = (pPVar3->graph_).edges_.
           super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(pPVar3->graph_).edges_.
               super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data + 8) != pEVar6) {
    lVar10 = 8;
    uVar8 = 0;
    do {
      local_48.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = *(pointer *)((long)pEVar6->vertexIndices_ + lVar10 + -8);
      local_50 = *(key_type *)((long)pEVar6->vertexIndices_ + lVar10);
      dVar1 = (pDVar11->costs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      pmVar7 = std::
               map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
               ::operator[]((this->vertices_).
                            super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                            (long)local_48.edge_labels.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,&local_50);
      *pmVar7 = *pmVar7 + dVar1;
      pmVar7 = std::
               map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
               ::operator[]((this->vertices_).
                            super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_50,
                            (key_type *)&local_48);
      *pmVar7 = dVar1 + *pmVar7;
      uVar8 = uVar8 + 1;
      pEVar6 = (pPVar3->graph_).edges_.
               super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x10;
    } while (uVar8 < (ulong)((long)*(pointer *)
                                    ((long)&(pPVar3->graph_).edges_.
                                            super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) - (long)pEVar6 >>
                            4));
    pDVar11 = this->data_;
  }
  getSolution(&local_48,this);
  vVar12 = evaluate<std::vector<double,std::allocator<double>>>
                     (pDVar11->problemGraph,&pDVar11->costs,pDVar11->costBirth,
                      pDVar11->costTermination,&local_48);
  this->objective_ = vVar12;
  if (local_48.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.edge_labels.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.edge_labels.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.edge_labels.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline void setup()
    {
        const auto& graph = data_.problemGraph.graph();
        const auto& costs = data_.costs;
        std::iota(parents_.begin(), parents_.end(), 0);

        for (size_t edge = 0; edge < graph.numberOfEdges(); ++edge) {

            const auto& v0 = graph.vertexOfEdge(edge, 0);
            const auto& v1 = graph.vertexOfEdge(edge, 1);

            updateEdgeWeight(v0, v1, costs[edge]);
        }
        objective_ = evaluate(data_, getSolution());
    }